

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

void impute_missing_values
               (double *numeric_data,int *categ_data,bool is_col_major,double *Xr,int64_t *Xr_ind,
               int64_t *Xr_indptr,size_t nrows,bool use_long_double,int nthreads,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  int *in_RCX;
  undefined1 in_DL;
  undefined8 in_R8;
  double *in_R9;
  size_t unaff_R14;
  int unaff_retaddr;
  IsoForest *in_stack_00000008;
  undefined1 in_stack_00000010;
  undefined7 in_stack_00000011;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  undefined8 in_stack_00000030;
  long *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd0;
  
  impute_missing_values<double,long>
            ((double *)(CONCAT17(in_DL,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),in_RCX,
             SUB81((ulong)in_R8 >> 0x38,0),in_R9,
             (long *)(CONCAT17(in_stack_00000010,in_stack_ffffffffffffffb0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffa8,unaff_R14,SUB81((ulong)in_stack_00000030 >> 0x38,0),
             unaff_retaddr,in_stack_00000008,
             (ExtIsoForest *)CONCAT71(in_stack_00000011,in_stack_00000010),
             (Imputer *)CONCAT44(in_stack_0000001c,in_stack_00000018));
  return;
}

Assistant:

ISOTREE_EXPORTED void impute_missing_values(real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, bool use_long_double, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    impute_missing_values<real_t, sparse_ix>
                          (numeric_data, categ_data, is_col_major,
                           Xr, Xr_ind, Xr_indptr,
                           nrows, use_long_double, nthreads,
                           model_outputs, model_outputs_ext,
                           imputer);
}